

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.c
# Opt level: O0

int delay_segment_start(mixed_segment *segment)

{
  uint local_34;
  float *pfStack_30;
  uint32_t i;
  float *out;
  long *plStack_20;
  uint32_t samples;
  delay_segment_data *data;
  mixed_segment *segment_local;
  
  plStack_20 = (long *)segment->data;
  data = (delay_segment_data *)segment;
  if ((*plStack_20 == 0) || (plStack_20[1] == 0)) {
    mixed_err(0x16);
    segment_local._4_4_ = 0;
  }
  else {
    mixed_buffer_clear((mixed_buffer *)(plStack_20 + 2));
    out._4_4_ = 0xffffffff;
    mixed_buffer_request_write
              (&stack0xffffffffffffffd0,(uint32_t *)((long)&out + 4),
               (mixed_buffer *)(plStack_20 + 2));
    for (local_34 = 0; local_34 < out._4_4_; local_34 = local_34 + 1) {
      pfStack_30[local_34] = 0.0;
    }
    mixed_buffer_finish_write(out._4_4_,(mixed_buffer *)(plStack_20 + 2));
    segment_local._4_4_ = 1;
  }
  return segment_local._4_4_;
}

Assistant:

int delay_segment_start(struct mixed_segment *segment){
  struct delay_segment_data *data = (struct delay_segment_data *)segment->data;
  if(data->in == 0 || data->out == 0){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }
  // Fill the entire buffer with nothing to initiate the delay.
  mixed_buffer_clear(&data->buffer);
  uint32_t samples = UINT32_MAX;
  float *out;
  mixed_buffer_request_write(&out, &samples, &data->buffer);
  for(uint32_t i=0; i<samples; ++i){
    out[i] = 0.0f;
  }
  mixed_buffer_finish_write(samples, &data->buffer);
  return 1;
}